

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_half_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::ConvertToHalfPass::GenHalfArith(ConvertToHalfPass *this,Instruction *inst)

{
  Instruction *pIVar1;
  bool bVar2;
  Op OVar3;
  uint32_t uVar4;
  DefUseManager *this_00;
  uint32_t local_94;
  anon_class_24_3_647bfbe2 local_90;
  function<void_(unsigned_int_*)> local_78;
  anon_class_16_2_0d955e3d local_58;
  function<void_(unsigned_int_*)> local_48;
  bool local_22;
  bool local_21;
  bool hasStructOperand;
  Instruction *pIStack_20;
  bool modified;
  Instruction *inst_local;
  ConvertToHalfPass *this_local;
  
  local_21 = false;
  local_22 = false;
  pIStack_20 = inst;
  inst_local = (Instruction *)this;
  OVar3 = opt::Instruction::opcode(inst);
  pIVar1 = pIStack_20;
  if (OVar3 == OpCompositeExtract) {
    local_58.hasStructOperand = &local_22;
    local_58.this = this;
    std::function<void(unsigned_int*)>::
    function<spvtools::opt::ConvertToHalfPass::GenHalfArith(spvtools::opt::Instruction*)::__0,void>
              ((function<void(unsigned_int*)> *)&local_48,&local_58);
    opt::Instruction::ForEachInId(pIVar1,&local_48);
    std::function<void_(unsigned_int_*)>::~function(&local_48);
    if ((local_22 & 1U) != 0) {
      return false;
    }
  }
  pIVar1 = pIStack_20;
  local_90.inst = &stack0xffffffffffffffe0;
  local_90.modified = &local_21;
  local_90.this = this;
  std::function<void(unsigned_int*)>::
  function<spvtools::opt::ConvertToHalfPass::GenHalfArith(spvtools::opt::Instruction*)::__1,void>
            ((function<void(unsigned_int*)> *)&local_78,&local_90);
  opt::Instruction::ForEachInId(pIVar1,&local_78);
  std::function<void_(unsigned_int_*)>::~function(&local_78);
  bVar2 = IsFloat(this,pIStack_20,0x20);
  pIVar1 = pIStack_20;
  if (bVar2) {
    uVar4 = opt::Instruction::type_id(pIStack_20);
    uVar4 = EquivFloatTypeId(this,uVar4,0x10);
    opt::Instruction::SetResultType(pIVar1,uVar4);
    local_94 = opt::Instruction::result_id(pIStack_20);
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)&this->converted_ids_,&local_94);
    local_21 = true;
  }
  if ((local_21 & 1U) != 0) {
    this_00 = Pass::get_def_use_mgr(&this->super_Pass);
    analysis::DefUseManager::AnalyzeInstUse(this_00,pIStack_20);
  }
  return (bool)(local_21 & 1);
}

Assistant:

bool ConvertToHalfPass::GenHalfArith(Instruction* inst) {
  bool modified = false;
  // If this is a OpCompositeExtract instruction and has a struct operand, we
  // should not relax this instruction. Doing so could cause a mismatch between
  // the result type and the struct member type.
  bool hasStructOperand = false;
  if (inst->opcode() == spv::Op::OpCompositeExtract) {
    inst->ForEachInId([&hasStructOperand, this](uint32_t* idp) {
      Instruction* op_inst = get_def_use_mgr()->GetDef(*idp);
      if (IsStruct(op_inst)) hasStructOperand = true;
    });
    if (hasStructOperand) {
      return false;
    }
  }
  // Convert all float32 based operands to float16 equivalent and change
  // instruction type to float16 equivalent.
  inst->ForEachInId([&inst, &modified, this](uint32_t* idp) {
    Instruction* op_inst = get_def_use_mgr()->GetDef(*idp);
    if (!IsFloat(op_inst, 32)) return;
    GenConvert(idp, 16, inst);
    modified = true;
  });
  if (IsFloat(inst, 32)) {
    inst->SetResultType(EquivFloatTypeId(inst->type_id(), 16));
    converted_ids_.insert(inst->result_id());
    modified = true;
  }
  if (modified) get_def_use_mgr()->AnalyzeInstUse(inst);
  return modified;
}